

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::DOMCharacterDataImpl::substringData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLSize_t count)

{
  int iVar1;
  XMLSize_t XVar2;
  DOMException *this_00;
  undefined4 extraout_var;
  MemoryManager *pMVar3;
  undefined4 extraout_var_00;
  XMLCh *pXVar4;
  DOMDocumentImpl *local_2090;
  MemoryManager *local_2080;
  XMLCh *retString;
  XMLCh temp [4096];
  XMLCh **local_50;
  XMLCh *newString;
  DOMDocumentImpl *doc;
  XMLSize_t len;
  XMLSize_t count_local;
  XMLSize_t offset_local;
  DOMNode *node_local;
  DOMCharacterDataImpl *this_local;
  
  XVar2 = DOMBuffer::getLen(this->fDataBuf);
  if (XVar2 < offset) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDoc == (DOMDocumentImpl *)0x0) {
      local_2080 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      local_2080 = DOMDocumentImpl::getMemoryManager(this->fDoc);
    }
    DOMException::DOMException(this_00,1,0,local_2080);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  iVar1 = (*node->_vptr_DOMNode[0xc])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_2090 = (DOMDocumentImpl *)0x0;
  }
  else {
    local_2090 = (DOMDocumentImpl *)(CONCAT44(extraout_var,iVar1) + -8);
  }
  if (XVar2 < 0xfff) {
    local_50 = &retString;
  }
  else {
    pMVar3 = DOMDocumentImpl::getMemoryManager(local_2090);
    iVar1 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,(XVar2 + 1) * 2);
    local_50 = (XMLCh **)CONCAT44(extraout_var_00,iVar1);
  }
  pXVar4 = DOMBuffer::getRawBuffer(this->fDataBuf);
  XMLString::copyNString((XMLCh *)local_50,pXVar4 + offset,count);
  *(undefined2 *)((long)local_50 + count * 2) = 0;
  pXVar4 = DOMDocumentImpl::getPooledString(local_2090,(XMLCh *)local_50);
  if (0xffe < XVar2) {
    pMVar3 = DOMDocumentImpl::getMemoryManager(local_2090);
    (*pMVar3->_vptr_MemoryManager[4])(pMVar3,local_50);
  }
  return pXVar4;
}

Assistant:

const XMLCh * DOMCharacterDataImpl::substringData(const DOMNode *node, XMLSize_t offset,
                                           XMLSize_t count) const
{

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //


    XMLSize_t len = fDataBuf->getLen();

    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();

    XMLCh* newString;
    XMLCh temp[4096];
    if (len >= 4095)
      newString = (XMLCh*) doc->getMemoryManager()->allocate
        (
            (len + 1) * sizeof(XMLCh)
        );//new XMLCh[len+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer()+offset, count);
    newString[count] = chNull;

    const XMLCh* retString = doc->getPooledString(newString);

    if (len >= 4095)
      doc->getMemoryManager()->deallocate(newString);//delete[] newString;

    return retString;

}